

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntPrint(Vec_Int_t *vVec)

{
  uint uVar1;
  int iVar2;
  int local_14;
  int Entry;
  int i;
  Vec_Int_t *vVec_local;
  
  uVar1 = Vec_IntSize(vVec);
  printf("Vector has %d entries: {",(ulong)uVar1);
  for (local_14 = 0; iVar2 = Vec_IntSize(vVec), local_14 < iVar2; local_14 = local_14 + 1) {
    uVar1 = Vec_IntEntry(vVec,local_14);
    printf(" %d",(ulong)uVar1);
  }
  printf(" }\n");
  return;
}

Assistant:

static inline void Vec_IntPrint( Vec_Int_t * vVec )
{
    int i, Entry;
    printf( "Vector has %d entries: {", Vec_IntSize(vVec) );
    Vec_IntForEachEntry( vVec, Entry, i )
        printf( " %d", Entry );
    printf( " }\n" );
}